

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * Strsafe(char *y)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  char *extraout_RAX;
  char *extraout_RAX_00;
  uint *in_RCX;
  long extraout_RDX;
  long lVar4;
  uint uVar5;
  long in_RSI;
  FILE *__stream;
  
  if (y == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = Strsafe_find(y);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(y);
      __stream = (FILE *)(long)((int)sVar3 + 1);
      pcVar2 = (char *)malloc((size_t)__stream);
      if (pcVar2 == (char *)0x0) {
        Strsafe_cold_1();
        pcVar2 = extraout_RAX;
        if ((*(char **)(in_RSI + 0x40) != (char *)0x0) && (**(char **)(in_RSI + 0x40) != '\0')) {
          fprintf(__stream,"{%s");
          pcVar2 = *(char **)(in_RSI + 0x40);
          do {
            if (*pcVar2 == '\n') {
              *in_RCX = *in_RCX + 1;
            }
            else if (*pcVar2 == '\0') break;
            pcVar2 = pcVar2 + 1;
          } while( true );
        }
        lVar4 = *(long *)(in_RSI + 0x38);
        if (lVar4 != 0) {
          if (*(int *)(extraout_RDX + 0xf4) == 0) {
            *in_RCX = *in_RCX + 1;
            tplt_linedir((FILE *)__stream,*(int *)(in_RSI + 0x30),*(char **)(extraout_RDX + 0xc0));
            lVar4 = *(long *)(in_RSI + 0x38);
          }
          fprintf(__stream,"{%s",lVar4);
          pcVar2 = *(char **)(in_RSI + 0x38);
          do {
            if (*pcVar2 == '\n') {
              *in_RCX = *in_RCX + 1;
            }
            else if (*pcVar2 == '\0') goto LAB_0010bafc;
            pcVar2 = pcVar2 + 1;
          } while( true );
        }
        goto LAB_0010bb3c;
      }
      strcpy(pcVar2,y);
      Strsafe_insert(pcVar2);
    }
  }
  return pcVar2;
LAB_0010bafc:
  fwrite("}\n",2,1,__stream);
  uVar5 = *in_RCX;
  uVar1 = uVar5 + 1;
  pcVar2 = (char *)(ulong)uVar1;
  *in_RCX = uVar1;
  if (*(int *)(extraout_RDX + 0xf4) == 0) {
    uVar5 = uVar5 + 2;
    *in_RCX = uVar5;
    tplt_linedir((FILE *)__stream,uVar5,*(char **)(extraout_RDX + 0xd0));
    pcVar2 = extraout_RAX_00;
  }
LAB_0010bb3c:
  __s = *(char **)(in_RSI + 0x48);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    fputs(__s,__stream);
    pcVar2 = *(char **)(in_RSI + 0x48);
    do {
      if (*pcVar2 == '\n') {
        *in_RCX = *in_RCX + 1;
      }
      else if (*pcVar2 == '\0') break;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    pcVar2 = (char *)fwrite("}\n",2,1,__stream);
    *in_RCX = *in_RCX + 1;
  }
  return pcVar2;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}